

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreCubeAddToList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t GVar1;
  ulong uVar2;
  
  pSta->iNext = *pRoot;
  uVar2 = (long)p->nStas - 1;
  GVar1 = SUB84(uVar2,0);
  *pRoot = GVar1;
  if ((Gia_StaAre_t *)
      ((long)p->nSize * (ulong)((uint)GVar1 & 0xfffff) * 4 +
      *(long *)((long)p->ppStas + (ulong)((uint)(uVar2 >> 0x11) & 0x3ff8))) == pSta) {
    return;
  }
  __assert_fail("pSta == Gia_ManAreSta(p, *pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                ,0x415,
                "void Gia_ManAreCubeAddToList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)");
}

Assistant:

static inline void Gia_ManAreCubeAddToList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    int fVerbose = 0;
    pSta->iNext = *pRoot;
    *pRoot = Gia_Int2Ptr( p->nStas - 1 );
    assert( pSta == Gia_ManAreSta(p, *pRoot) );
if ( fVerbose )
{
printf( "Adding cube: " );
Gia_ManArePrintCube( p, pSta );
//printf( "\n" );
}
}